

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void std::
     __insertion_sort<QList<QGraphicsObject*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
               (iterator __first,iterator __last,
               _Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)> __comp)

{
  QGraphicsObject *pQVar1;
  bool bVar2;
  QGraphicsItem *pQVar3;
  QGraphicsItem *pQVar4;
  iterator __last_00;
  
  if (__first.i != __last.i) {
    for (__last_00.i = __first.i + 1; __last_00.i != __last.i; __last_00.i = __last_00.i + 1) {
      pQVar4 = &(*__last_00.i)->super_QGraphicsItem;
      if (*__last_00.i == (QGraphicsObject *)0x0) {
        pQVar4 = (QGraphicsItem *)0x0;
      }
      pQVar3 = &(*__first.i)->super_QGraphicsItem;
      if (*__first.i == (QGraphicsObject *)0x0) {
        pQVar3 = (QGraphicsItem *)0x0;
      }
      bVar2 = (*__comp._M_comp)(pQVar4,pQVar3);
      if (bVar2) {
        pQVar1 = *__last_00.i;
        __copy_move_backward<true,false,std::random_access_iterator_tag>::
        __copy_move_b<QList<QGraphicsObject*>::iterator,QList<QGraphicsObject*>::iterator>
                  (__first,__last_00,(iterator)(__last_00.i + 1));
        *__first.i = pQVar1;
      }
      else {
        __unguarded_linear_insert<QList<QGraphicsObject*>::iterator,__gnu_cxx::__ops::_Val_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                  (__last_00,
                   (_Val_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)
                   __comp._M_comp);
      }
    }
  }
  return;
}

Assistant:

inline constexpr bool operator!=(iterator o) const { return i != o.i; }